

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdecompresshelper.cpp
# Opt level: O3

qsizetype __thiscall
QDecompressHelper::readBrotli(QDecompressHelper *this,char *data,qsizetype maxSize)

{
  size_t *psVar1;
  char *pcVar2;
  void *pvVar3;
  QByteArray *pQVar4;
  QArrayData *pQVar5;
  char16_t *pcVar6;
  qsizetype qVar7;
  byte bVar8;
  int iVar9;
  undefined4 uVar10;
  uint8_t *puVar11;
  long lVar12;
  ulong __n;
  long lVar13;
  long lVar14;
  long in_FS_OFFSET;
  QAnyStringView QVar15;
  size_t unusedDecodedSize;
  uint8_t *decodedPtr;
  size_t encodedBytesRemaining;
  uint8_t *encodedPtr;
  QArrayData *local_90 [3];
  QArrayData *local_78;
  char16_t *pcStack_70;
  qsizetype local_68;
  long local_58;
  char *local_50;
  long local_48;
  char *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pvVar3 = this->decoderPointer;
  lVar14 = 0;
  if ((0 < maxSize) && (this->decoderHasData != false)) {
    lVar14 = 0;
    do {
      if (this->brotliUnconsumedDataPtr != (uint8_t *)0x0) {
        __n = maxSize - lVar14;
        if (this->brotliUnconsumedAmount < (ulong)(maxSize - lVar14)) {
          __n = this->brotliUnconsumedAmount;
        }
        memcpy(data + lVar14,this->brotliUnconsumedDataPtr,__n);
        this->brotliUnconsumedDataPtr = this->brotliUnconsumedDataPtr + __n;
        lVar14 = lVar14 + __n;
        psVar1 = &this->brotliUnconsumedAmount;
        *psVar1 = *psVar1 - __n;
        if (*psVar1 == 0) {
          this->brotliUnconsumedDataPtr = (uint8_t *)0x0;
          this->decoderHasData = false;
        }
      }
      iVar9 = BrotliDecoderHasMoreOutput(pvVar3);
      if (iVar9 == 1) {
        puVar11 = (uint8_t *)BrotliDecoderTakeOutput(pvVar3);
        this->brotliUnconsumedDataPtr = puVar11;
        this->decoderHasData = true;
        bVar8 = 1;
      }
      else {
        bVar8 = this->decoderHasData;
      }
    } while (((bVar8 & 1) != 0) && (lVar14 < maxSize));
  }
  if (maxSize != lVar14) {
    if ((this->compressedDataBuffer).bufferCompleteSize == 0) {
      lVar13 = 0;
      local_40 = (char *)0x0;
    }
    else {
      pQVar4 = (this->compressedDataBuffer).buffers.d.ptr;
      lVar13 = (this->compressedDataBuffer).firstPos;
      local_40 = (pQVar4->d).ptr;
      if (local_40 == (char *)0x0) {
        local_40 = (char *)&QByteArray::_empty;
      }
      local_40 = local_40 + lVar13;
      lVar13 = (pQVar4->d).size - lVar13;
    }
    local_50 = data + lVar14;
    local_58 = maxSize - lVar14;
    maxSize = lVar14;
    local_48 = lVar13;
    if (local_58 != 0) {
      do {
        lVar14 = local_58;
        uVar10 = BrotliDecoderDecompressStream(pvVar3,&local_48,&local_40,&local_58,&local_50,0);
        maxSize = (lVar14 - local_58) + maxSize;
        switch(uVar10) {
        case 0:
          lVar14 = 0;
          QCoreApplication::translate((char *)local_90,"QHttp","Brotli error: %1",0);
          uVar10 = FUN_00165790(pvVar3);
          lVar13 = FUN_001668d0(uVar10);
          if (lVar13 != 0) {
            lVar12 = -1;
            do {
              lVar14 = lVar12 + 1;
              pcVar2 = (char *)(lVar13 + 1 + lVar12);
              lVar12 = lVar14;
            } while (*pcVar2 != '\0');
          }
          QVar15.m_size = (size_t)local_90;
          QVar15.field_0.m_data = &local_78;
          QString::arg_impl(QVar15,(int)lVar13,(QChar)(char16_t)lVar14);
          pQVar5 = &((this->errorStr).d.d)->super_QArrayData;
          pcVar6 = (this->errorStr).d.ptr;
          (this->errorStr).d.d = (Data *)local_78;
          (this->errorStr).d.ptr = pcStack_70;
          qVar7 = (this->errorStr).d.size;
          (this->errorStr).d.size = local_68;
          local_78 = pQVar5;
          pcStack_70 = pcVar6;
          local_68 = qVar7;
          if (pQVar5 != (QArrayData *)0x0) {
            LOCK();
            (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i =
                 (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((pQVar5->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(pQVar5,2,0x10);
            }
          }
          if (local_90[0] != (QArrayData *)0x0) {
            LOCK();
            (local_90[0]->ref_)._q_value.super___atomic_base<int>._M_i =
                 (local_90[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((local_90[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(local_90[0],2,0x10);
            }
          }
          maxSize = -1;
          goto LAB_001e45d0;
        case 1:
          BrotliDecoderDestroyInstance(pvVar3);
          this->decoderPointer = (void *)0x0;
          QList<QByteArray>::clear((QList<QByteArray> *)this);
          (this->compressedDataBuffer).bufferCompleteSize = 0;
          (this->compressedDataBuffer).firstPos = 0;
          goto LAB_001e45d0;
        case 2:
          QByteDataBuffer::advanceReadPointer(&this->compressedDataBuffer,lVar13);
          if ((this->compressedDataBuffer).bufferCompleteSize == 0) goto LAB_001e45d0;
          pQVar4 = (this->compressedDataBuffer).buffers.d.ptr;
          lVar14 = (this->compressedDataBuffer).firstPos;
          lVar13 = (pQVar4->d).size - lVar14;
          if (lVar13 == 0) goto LAB_001e45d0;
          local_40 = (pQVar4->d).ptr;
          if (local_40 == (char *)0x0) {
            local_40 = (char *)&QByteArray::_empty;
          }
          local_40 = local_40 + lVar14;
          local_48 = lVar13;
          break;
        case 3:
          iVar9 = BrotliDecoderHasMoreOutput(pvVar3);
          this->decoderHasData = iVar9 != 0;
        }
      } while (local_58 != 0);
    }
    QByteDataBuffer::advanceReadPointer(&this->compressedDataBuffer,lVar13 - local_48);
  }
LAB_001e45d0:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return maxSize;
}

Assistant:

qsizetype QDecompressHelper::readBrotli(char *data, const qsizetype maxSize)
{
#if !QT_CONFIG(brotli)
    Q_UNUSED(data);
    Q_UNUSED(maxSize);
    Q_UNREACHABLE();
#else
    qint64 bytesDecoded = 0;

    BrotliDecoderState *brotliDecoderState = toBrotliPointer(decoderPointer);

    while (decoderHasData && bytesDecoded < maxSize) {
        Q_ASSERT(brotliUnconsumedDataPtr || BrotliDecoderHasMoreOutput(brotliDecoderState));
        if (brotliUnconsumedDataPtr) {
            Q_ASSERT(brotliUnconsumedAmount);
            size_t toRead = std::min(size_t(maxSize - bytesDecoded), brotliUnconsumedAmount);
            memcpy(data + bytesDecoded, brotliUnconsumedDataPtr, toRead);
            bytesDecoded += toRead;
            brotliUnconsumedAmount -= toRead;
            brotliUnconsumedDataPtr += toRead;
            if (brotliUnconsumedAmount == 0) {
                brotliUnconsumedDataPtr = nullptr;
                decoderHasData = false;
            }
        }
        if (BrotliDecoderHasMoreOutput(brotliDecoderState) == BROTLI_TRUE) {
            brotliUnconsumedDataPtr =
                    BrotliDecoderTakeOutput(brotliDecoderState, &brotliUnconsumedAmount);
            decoderHasData = true;
        }
    }
    if (bytesDecoded == maxSize)
        return bytesDecoded;
    Q_ASSERT(bytesDecoded < maxSize);

    QByteArrayView input = compressedDataBuffer.readPointer();
    const uint8_t *encodedPtr = reinterpret_cast<const uint8_t *>(input.data());
    size_t encodedBytesRemaining = input.size();

    uint8_t *decodedPtr = reinterpret_cast<uint8_t *>(data + bytesDecoded);
    size_t unusedDecodedSize = size_t(maxSize - bytesDecoded);
    while (unusedDecodedSize > 0) {
        auto previousUnusedDecodedSize = unusedDecodedSize;
        BrotliDecoderResult result = BrotliDecoderDecompressStream(
                brotliDecoderState, &encodedBytesRemaining, &encodedPtr, &unusedDecodedSize,
                &decodedPtr, nullptr);
        bytesDecoded += previousUnusedDecodedSize - unusedDecodedSize;

        switch (result) {
        Q_UNLIKELY_BRANCH
        case BROTLI_DECODER_RESULT_ERROR:
            //: Brotli (compression algorithm) decoding error, e.g. corrupted input or memory allocation problem.
            errorStr = QCoreApplication::translate("QHttp", "Brotli error: %1")
                           .arg(QUtf8StringView{BrotliDecoderErrorString(
                               BrotliDecoderGetErrorCode(brotliDecoderState))});
            return -1;
        case BROTLI_DECODER_RESULT_SUCCESS:
            BrotliDecoderDestroyInstance(brotliDecoderState);
            decoderPointer = nullptr;
            compressedDataBuffer.clear();
            return bytesDecoded;
        case BROTLI_DECODER_RESULT_NEEDS_MORE_INPUT:
            compressedDataBuffer.advanceReadPointer(input.size());
            input = compressedDataBuffer.readPointer();
            if (!input.isEmpty()) {
                encodedPtr = reinterpret_cast<const uint8_t *>(input.constData());
                encodedBytesRemaining = input.size();
                break;
            }
            return bytesDecoded;
        case BROTLI_DECODER_RESULT_NEEDS_MORE_OUTPUT:
            // Some data is leftover inside the brotli decoder, remember for next time
            decoderHasData = BrotliDecoderHasMoreOutput(brotliDecoderState);
            Q_ASSERT(unusedDecodedSize == 0);
            break;
        }
    }
    compressedDataBuffer.advanceReadPointer(input.size() - encodedBytesRemaining);
    return bytesDecoded;
#endif
}